

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O3

void TestSeekAndTell(void)

{
  ostream *poVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 **local_3f8;
  undefined1 **local_3f0;
  undefined **local_3e8;
  undefined1 local_3e0;
  undefined8 *local_3d8;
  undefined1 ***local_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [16];
  lazy_ostream local_3a8;
  undefined8 *local_398;
  char *local_390;
  assertion_result local_388;
  undefined **local_370;
  undefined1 local_368;
  undefined8 *local_360;
  undefined1 **local_358;
  const_string local_350;
  string junk;
  istream is;
  ostream os;
  
  os.super_ostream._vptr_basic_ostream = (_func_int **)anon_var_dwarf_a2e99;
  os.super_ostream._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  os.super_ostream._16_8_ = 0x1d8;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&os);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_3e8 = (undefined **)CONCAT71(local_3e8._1_7_,1);
  is.super_istream._M_gcount = is.super_istream._M_gcount & 0xffffffffffffff00;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001dbd98;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  is.super_istream._24_8_ = anon_var_dwarf_a43b8;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(lazy_ostream *)&is);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_3e8);
  makeString_abi_cxx11_(&junk,0x800);
  avro::ostream::ostream(&os);
  iVar2 = 5;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              (&os.super_ostream,junk._M_dataplus._M_p,junk._M_string_length);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Buffer has ",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bytes\n",7);
  avro::istream::istream(&is,(OutputBuffer *)&os.super_ostream.field_0x48);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1e9;
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_390 = "";
  local_3f0 = *(undefined1 ***)(is.super_istream._80_8_ + 0xa8);
  local_3b8._0_8_ = &local_3f0;
  local_3f8 = (undefined1 **)(junk._M_string_length * 5);
  local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3f0 == local_3f8);
  local_388.m_message.px = (element_type *)0x0;
  local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_350.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_350.m_end = "";
  local_3d0 = (undefined1 ***)local_3b8;
  local_3e0 = 0;
  local_3e8 = &PTR__lazy_ostream_001dc7f0;
  local_3d8 = &boost::unit_test::lazy_ostream::inst;
  local_358 = &local_3c8;
  local_368 = 0;
  local_370 = &PTR__lazy_ostream_001dc7f0;
  local_360 = &boost::unit_test::lazy_ostream::inst;
  local_3c8 = (undefined1 *)&local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_388,&local_3a8,&local_350,0x1e9,CHECK,CHECK_EQUAL,2,"is.getBuffer().size()",
             &local_3e8,"junk.size() * i",&local_370);
  boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
  std::istream::seekg(&is,2000,0);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1eb;
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_390 = "";
  local_3b8 = std::istream::tellg();
  local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_3b8._0_8_ == 2000);
  local_3c8 = (undefined1 *)0x7d0;
  local_3c0 = 0;
  local_388.m_message.px = (element_type *)0x0;
  local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_350.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_350.m_end = "";
  local_3f0 = (undefined1 **)local_3b8;
  local_3e0 = 0;
  local_3e8 = &PTR__lazy_ostream_001dca30;
  local_3d8 = &boost::unit_test::lazy_ostream::inst;
  local_3d0 = &local_3f0;
  local_3f8 = &local_3c8;
  local_368 = 0;
  local_370 = &PTR__lazy_ostream_001dca30;
  local_360 = &boost::unit_test::lazy_ostream::inst;
  local_358 = (undefined1 **)&local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_388,&local_3a8,&local_350,0x1eb,CHECK,CHECK_EQUAL,2,"is.tellg()",&local_3e8,
             "static_cast<std::streampos>(2000)",&local_370);
  boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
  std::istream::seekg(&is,6000,0);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1ed;
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_390 = "";
  auVar3 = std::istream::tellg();
  local_3c8 = (undefined1 *)0x1770;
  local_3c0 = 0;
  local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(auVar3._0_8_ == 6000);
  local_388.m_message.px = (element_type *)0x0;
  local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_350.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_350.m_end = "";
  local_3f0 = (undefined1 **)local_3b8;
  local_3e0 = 0;
  local_3e8 = &PTR__lazy_ostream_001dca30;
  local_3d8 = &boost::unit_test::lazy_ostream::inst;
  local_3d0 = &local_3f0;
  local_3f8 = &local_3c8;
  local_368 = 0;
  local_370 = &PTR__lazy_ostream_001dca30;
  local_360 = &boost::unit_test::lazy_ostream::inst;
  local_358 = (undefined1 **)&local_3f8;
  local_3b8 = auVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_388,&local_3a8,&local_350,0x1ed,CHECK,CHECK_EQUAL,2,"is.tellg()",&local_3e8,
             "static_cast<std::streampos>(6000)",&local_370);
  boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
  std::istream::seekg(&is,*(undefined8 *)(is.super_istream._80_8_ + 0xa8),0);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1ef;
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_390 = "";
  auVar3 = std::istream::tellg();
  local_3c8 = *(undefined1 **)(is.super_istream._80_8_ + 0xa8);
  local_3c0 = 0;
  local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(auVar3._0_8_ == local_3c8);
  local_388.m_message.px = (element_type *)0x0;
  local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_350.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_350.m_end = "";
  local_3f0 = (undefined1 **)local_3b8;
  local_3e0 = 0;
  local_3e8 = &PTR__lazy_ostream_001dca30;
  local_3d8 = &boost::unit_test::lazy_ostream::inst;
  local_3d0 = &local_3f0;
  local_3f8 = &local_3c8;
  local_368 = 0;
  local_370 = &PTR__lazy_ostream_001dca30;
  local_360 = &boost::unit_test::lazy_ostream::inst;
  local_358 = (undefined1 **)&local_3f8;
  local_3b8 = auVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_388,&local_3a8,&local_350,0x1ef,CHECK,CHECK_EQUAL,2,"is.tellg()",&local_3e8,
             "static_cast<std::streampos>(is.getBuffer().size())",&local_370);
  boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
  std::istream::seekg(&is,*(long *)(is.super_istream._80_8_ + 0xa8) + 1,0);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1f1;
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_398 = &boost::unit_test::lazy_ostream::inst;
  local_390 = "";
  auVar3 = std::istream::tellg();
  local_3c8 = (undefined1 *)0xffffffffffffffff;
  local_3c0 = 0;
  local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(auVar3._0_8_ == -1);
  local_388.m_message.px = (element_type *)0x0;
  local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_350.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_350.m_end = "";
  local_3f0 = (undefined1 **)local_3b8;
  local_3e0 = 0;
  local_3e8 = &PTR__lazy_ostream_001dca30;
  local_3d8 = &boost::unit_test::lazy_ostream::inst;
  local_3d0 = &local_3f0;
  local_3f8 = &local_3c8;
  local_368 = 0;
  local_370 = &PTR__lazy_ostream_001dca30;
  local_360 = &boost::unit_test::lazy_ostream::inst;
  local_358 = (undefined1 **)&local_3f8;
  local_3b8 = auVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_388,&local_3a8,&local_350,0x1f1,CHECK,CHECK_EQUAL,2,"is.tellg()",&local_3e8,
             "static_cast<std::streampos>(-1)",&local_370);
  boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
  is.super_istream._vptr_basic_istream = (_func_int **)(avro::istream::vtable + 0x18);
  is.super_istream._136_8_ = 0x1db690;
  is.super_istream._16_8_ = &PTR__istreambuf_001db718;
  boost::detail::shared_count::~shared_count((shared_count *)&is.super_istream.field_0x58);
  is.super_istream._16_8_ = sysconf;
  std::locale::~locale((locale *)&is.super_istream.field_0x48);
  is.super_istream._vptr_basic_istream =
       (_func_int **)(std::istream-in-avro::istream::construction_vtable + 0x18);
  is.super_istream._136_8_ = 0x1db6e0;
  is.super_istream._M_gcount = 0;
  std::ios_base::~ios_base((ios_base *)&is.super_istream.field_0x88);
  os.super_ostream._vptr_basic_ostream = (_func_int **)(avro::ostream::vtable + 0x18);
  os.super_ostream._88_8_ = 0x1db8a0;
  os.super_ostream._8_8_ = &PTR__ostreambuf_001db928;
  boost::detail::shared_count::~shared_count((shared_count *)&os.super_ostream.field_0x50);
  os.super_ostream._8_8_ = sysconf;
  std::locale::~locale((locale *)&os.super_ostream.field_0x40);
  std::ios_base::~ios_base((ios_base *)&os.super_ostream.field_0x58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)junk._M_dataplus._M_p != &junk.field_2) {
    operator_delete(junk._M_dataplus._M_p,junk.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestSeekAndTell()
{
    BOOST_TEST_MESSAGE( "TestSeekAndTell");

    {
        std::string junk = makeString(kDefaultBlockSize/2);

        ostream os;

        // write enough bytes to a buffer, to create at least 3 blocks
        int i = 0;
        for(; i < 5; ++i) {
            os << junk;
        }

        const OutputBuffer &buf = os.getBuffer();
        cout << "Buffer has " << buf.size() << " bytes\n";

        istream is(os.getBuffer());
        BOOST_CHECK_EQUAL(is.getBuffer().size(), junk.size() * i);
        is.seekg(2000);
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(2000));
        is.seekg(6000);
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(6000));
        is.seekg(is.getBuffer().size());
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(is.getBuffer().size()));
        is.seekg(is.getBuffer().size()+1);
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(-1));

    }
}